

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpheaders.cpp
# Opt level: O0

QByteArrayView __thiscall
QHttpHeaders::value(QHttpHeaders *this,WellKnownHeader name,QByteArrayView defaultValue)

{
  long lVar1;
  QByteArrayView QVar2;
  bool bVar3;
  storage_type *in_RCX;
  qsizetype in_RDX;
  undefined4 in_ESI;
  QHttpHeadersPrivate *in_RDI;
  long in_FS_OFFSET;
  QByteArrayView QVar4;
  WellKnownHeader in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff98;
  storage_type *in_stack_ffffffffffffffc8;
  storage_type *local_30;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar3 = isEmpty((QHttpHeaders *)0x1c7cfe);
  local_30 = in_RCX;
  if (!bVar3) {
    QExplicitlySharedDataPointer<QHttpHeadersPrivate>::operator->
              ((QExplicitlySharedDataPointer<QHttpHeadersPrivate> *)0x1c7d24);
    HeaderName::HeaderName((HeaderName *)0x1c7d37,in_stack_ffffffffffffff7c);
    QVar4.m_data = in_stack_ffffffffffffffc8;
    QVar4.m_size = (qsizetype)in_RCX;
    QVar4 = QHttpHeadersPrivate::value
                      (in_RDI,(HeaderName *)CONCAT44(in_ESI,in_stack_ffffffffffffff98),QVar4);
    in_RDX = QVar4.m_size;
    local_30 = QVar4.m_data;
    HeaderName::~HeaderName((HeaderName *)0x1c7d78);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  QVar2.m_data = local_30;
  QVar2.m_size = in_RDX;
  return QVar2;
}

Assistant:

const noexcept
{
    if (isEmpty())
        return defaultValue;

    return d->value(HeaderName{name}, defaultValue);
}